

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

VkResult vkb::detail::
         get_vector<VkExtensionProperties,VkResult(*&)(char_const*,unsigned_int*,VkExtensionProperties*),char(&)[256]>
                   (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *out,
                   _func_VkResult_char_ptr_uint_ptr_VkExtensionProperties_ptr **f,char (*ts) [256])

{
  VkResult VVar1;
  uint32_t count;
  uint local_2c;
  
  local_2c = 0;
  do {
    VVar1 = (**f)(*ts,&local_2c,(VkExtensionProperties *)0x0);
    if (VVar1 != VK_SUCCESS) {
      return VVar1;
    }
    std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::resize
              (out,(ulong)local_2c);
    VVar1 = (**f)(*ts,&local_2c,
                  (out->
                  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>)
                  ._M_impl.super__Vector_impl_data._M_start);
    std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::resize
              (out,(ulong)local_2c);
  } while (VVar1 == VK_INCOMPLETE);
  return VVar1;
}

Assistant:

auto get_vector(std::vector<T>& out, F&& f, Ts&&... ts) -> VkResult {
    uint32_t count = 0;
    VkResult err;
    do {
        err = f(ts..., &count, nullptr);
        if (err != VK_SUCCESS) {
            return err;
        };
        out.resize(count);
        err = f(ts..., &count, out.data());
        out.resize(count);
    } while (err == VK_INCOMPLETE);
    return err;
}